

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase.h
# Opt level: O1

PointType __thiscall jhu::thrax::PhrasalRule::terminalIndex<true>(PhrasalRule *this,PointType i)

{
  Span SVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  undefined2 in_register_00000032;
  int iVar6;
  
  iVar6 = CONCAT22(in_register_00000032,i);
  SVar1 = (this->lhs).span.src;
  if ((iVar6 < (int)SVar1 >> 0x10) && (SVar1.start <= iVar6)) {
    iVar3 = iVar6 - (int)SVar1;
    lVar4 = 0;
    while( true ) {
      iVar2 = *(int *)((long)&(this->nts)._M_elems[0].span.src.start + lVar4);
      iVar5 = 3;
      if ((short)iVar2 <= iVar6) {
        iVar5 = 1;
        if (iVar2 >> 0x10 <= iVar6) {
          iVar3 = iVar3 + (iVar2 - (iVar2 >> 0x10));
          iVar5 = 0;
        }
      }
      if ((iVar5 != 3) && (iVar5 != 0)) break;
      lVar4 = lVar4 + 0x18;
      if (lVar4 == 0x60) {
        return (PointType)iVar3;
      }
    }
  }
  return -1;
}

Assistant:

Span get() const {
    if constexpr (SourceSide) {
      return src;
    } else {
      return tgt;
    }
  }